

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVectorTests.cpp
# Opt level: O0

void __thiscall anon_unknown.dwarf_70180c::Constructable::~Constructable(Constructable *this)

{
  StringRef capturedExpression;
  ExprLhs<bool> EVar1;
  AssertionHandler *in_RDI;
  StringRef SVar2;
  AssertionHandler catchAssertionHandler;
  undefined4 in_stack_ffffffffffffff48;
  undefined4 uVar3;
  undefined4 in_stack_ffffffffffffff4c;
  undefined7 in_stack_ffffffffffffff50;
  undefined1 in_stack_ffffffffffffff57;
  SourceLineInfo *this_00;
  StringRef in_stack_ffffffffffffff68;
  SourceLineInfo local_70;
  StringRef local_60;
  
  local_60 = operator____catch_sr
                       ((char *)CONCAT17(in_stack_ffffffffffffff57,in_stack_ffffffffffffff50),
                        CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48));
  this_00 = &local_70;
  Catch::SourceLineInfo::SourceLineInfo
            (this_00,
             "/workspace/llm4binary/github/license_c_cmakelists/MikePopoloski[P]slang/tests/unittests/util/SmallVectorTests.cpp"
             ,0x2e);
  SVar2 = operator____catch_sr
                    ((char *)CONCAT17(in_stack_ffffffffffffff57,in_stack_ffffffffffffff50),
                     CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48));
  uVar3 = 2;
  capturedExpression.m_size = (size_type)in_RDI;
  capturedExpression.m_start = (char *)this_00;
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)CONCAT17(in_stack_ffffffffffffff57,in_stack_ffffffffffffff50),
             in_stack_ffffffffffffff68,(SourceLineInfo *)CONCAT44(in_stack_ffffffffffffff4c,2),
             capturedExpression,(Flags)SVar2.m_start);
  EVar1 = Catch::operator<=<bool,_0>((Decomposer *)CONCAT44(in_stack_ffffffffffffff4c,uVar3),false);
  Catch::AssertionHandler::handleExpr<bool>(in_RDI,(ExprLhs<bool> *)this_00);
  Catch::AssertionHandler::complete
            ((AssertionHandler *)CONCAT17(EVar1.m_lhs,in_stack_ffffffffffffff50));
  Catch::AssertionHandler::~AssertionHandler
            ((AssertionHandler *)CONCAT17(EVar1.m_lhs,in_stack_ffffffffffffff50));
  (anonymous_namespace)::Constructable::numDestructorCalls =
       (anonymous_namespace)::Constructable::numDestructorCalls + 1;
  *(undefined1 *)&(in_RDI->m_assertionInfo).macroName.m_start = 0;
  *(undefined4 *)((long)&(in_RDI->m_assertionInfo).macroName.m_start + 4) = 0;
  return;
}

Assistant:

~Constructable() {
        CHECK(constructed);
        ++numDestructorCalls;
        constructed = false;
        value = 0;
    }